

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_IterMulti::_Run(_Test_IterMulti *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DB *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  string local_238;
  Status local_218;
  undefined8 local_210;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [16];
  Status local_1f0 [2];
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  Tester local_1d0;
  Iterator *iter;
  
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x33b;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  paVar1 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"a","");
  local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"va","");
  local_1f0[0].state_ = local_238._M_dataplus._M_p;
  local_1e0 = (uint)local_210;
  uStack_1dc = local_210._4_4_;
  uStack_1d8 = uStack_208;
  uStack_1d4 = uStack_204;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_218);
  test::Tester::IsOk(&local_1d0,&local_218);
  if (local_218.state_ != (char *)0x0) {
    operator_delete__(local_218.state_);
  }
  if (local_210 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x33c;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"b","");
  local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vb","");
  local_1f0[0].state_ = local_238._M_dataplus._M_p;
  local_1e0 = (uint)local_210;
  uStack_1dc = local_210._4_4_;
  uStack_1d8 = uStack_208;
  uStack_1d4 = uStack_204;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_218);
  test::Tester::IsOk(&local_1d0,&local_218);
  if (local_218.state_ != (char *)0x0) {
    operator_delete__(local_218.state_);
  }
  if (local_210 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x33d;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"c","");
  local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vc","");
  local_1f0[0].state_ = local_238._M_dataplus._M_p;
  local_1e0 = (uint)local_210;
  uStack_1dc = local_210._4_4_;
  uStack_1d8 = uStack_208;
  uStack_1d4 = uStack_204;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_218);
  test::Tester::IsOk(&local_1d0,&local_218);
  if (local_218.state_ != (char *)0x0) {
    operator_delete__(local_218.state_);
  }
  if (local_210 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  pDVar2 = (this->super_DBTest).db_;
  local_1d0.fname_ = (char *)0x0;
  local_1d0.ok_ = false;
  local_1d0._1_7_ = 1;
  iVar3 = (*pDVar2->_vptr_DB[6])(pDVar2,&local_1d0);
  iter = (Iterator *)CONCAT44(extraout_var,iVar3);
  (*iter->_vptr_Iterator[3])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x341;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"a->va");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x343;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"b->vb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x345;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"c->vc");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x347;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            (&local_1d0,&local_238,(char (*) [10])"(invalid)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[3])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x349;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"a->va");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x34b;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            (&local_1d0,&local_238,(char (*) [10])"(invalid)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[4])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x34e;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"c->vc");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x350;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"b->vb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x352;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"a->va");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x354;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            (&local_1d0,&local_238,(char (*) [10])"(invalid)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[4])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x356;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"c->vc");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x358;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            (&local_1d0,&local_238,(char (*) [10])"(invalid)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0._0_8_ = "";
  local_1d0.fname_ = (char *)0x0;
  (*iter->_vptr_Iterator[5])(iter,&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x35b;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"a->va");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0._0_8_ = "a";
  local_1d0.fname_ = (char *)0x1;
  (*iter->_vptr_Iterator[5])(iter,&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x35d;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  paVar1 = &local_238.field_2;
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"a->va");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0._0_8_ = "ax";
  local_1d0.fname_ = (char *)0x2;
  (*iter->_vptr_Iterator[5])(iter,&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x35f;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"b->vb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0._0_8_ = "b";
  local_1d0.fname_ = (char *)0x1;
  (*iter->_vptr_Iterator[5])(iter,&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x361;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"b->vb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0._0_8_ = "z";
  local_1d0.fname_ = (char *)0x1;
  (*iter->_vptr_Iterator[5])(iter,&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x363;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            (&local_1d0,&local_238,(char (*) [10])"(invalid)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[4])(iter);
  (*iter->_vptr_Iterator[7])(iter);
  (*iter->_vptr_Iterator[7])(iter);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x36a;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"b->vb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[3])(iter);
  (*iter->_vptr_Iterator[6])(iter);
  (*iter->_vptr_Iterator[6])(iter);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x371;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"b->vb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x374;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"a","");
  local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"va2","");
  local_1f0[0].state_ = local_238._M_dataplus._M_p;
  local_1e0 = (uint)local_210;
  uStack_1dc = local_210._4_4_;
  uStack_1d8 = uStack_208;
  uStack_1d4 = uStack_204;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_218);
  test::Tester::IsOk(&local_1d0,&local_218);
  if (local_218.state_ != (char *)0x0) {
    operator_delete__(local_218.state_);
  }
  if (local_210 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x375;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"a2","");
  local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"va3","");
  local_1f0[0].state_ = local_238._M_dataplus._M_p;
  local_1e0 = (uint)local_210;
  uStack_1dc = local_210._4_4_;
  uStack_1d8 = uStack_208;
  uStack_1d4 = uStack_204;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_218);
  test::Tester::IsOk(&local_1d0,&local_218);
  if (local_218.state_ != (char *)0x0) {
    operator_delete__(local_218.state_);
  }
  if (local_210 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x376;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"b","");
  local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vb2","");
  local_1f0[0].state_ = local_238._M_dataplus._M_p;
  local_1e0 = (uint)local_210;
  uStack_1dc = local_210._4_4_;
  uStack_1d8 = uStack_208;
  uStack_1d4 = uStack_204;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_218);
  test::Tester::IsOk(&local_1d0,&local_218);
  if (local_218.state_ != (char *)0x0) {
    operator_delete__(local_218.state_);
  }
  if (local_210 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x377;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"c","");
  local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vc2","");
  local_1f0[0].state_ = local_238._M_dataplus._M_p;
  local_1e0 = (uint)local_210;
  uStack_1dc = local_210._4_4_;
  uStack_1d8 = uStack_208;
  uStack_1d4 = uStack_204;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_218);
  test::Tester::IsOk(&local_1d0,&local_218);
  if (local_218.state_ != (char *)0x0) {
    operator_delete__(local_218.state_);
  }
  if (local_210 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x378;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"b","");
  local_1e0 = local_1e0 & 0xffffff00;
  local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p;
  uStack_208 = (undefined4)local_238._M_string_length;
  uStack_204 = local_238._M_string_length._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[3])(local_1f0);
  test::Tester::IsOk(&local_1d0,local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0[0].state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_1f0[0].state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[3])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x37a;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"a->va");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x37c;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"b->vb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x37e;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"c->vc");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[6])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x380;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            (&local_1d0,&local_238,(char (*) [10])"(invalid)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[4])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x382;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"c->vc");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 900;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"b->vb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x386;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>(&local_1d0,&local_238,(char (*) [6])"a->va");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[7])(iter);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0.line_ = 0x388;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1d0 + 0x18));
  DBTest::IterStatus_abi_cxx11_(&local_238,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            (&local_1d0,&local_238,(char (*) [10])"(invalid)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  (*iter->_vptr_Iterator[1])(iter);
  return;
}

Assistant:

TEST(DBTest, IterMulti) {
  ASSERT_OK(Put("a", "va"));
  ASSERT_OK(Put("b", "vb"));
  ASSERT_OK(Put("c", "vc"));
  Iterator* iter = db_->NewIterator(ReadOptions());

  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Seek("a");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Seek("ax");
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Seek("b");
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Seek("z");
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  // Switch from reverse to forward
  iter->SeekToLast();
  iter->Prev();
  iter->Prev();
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");

  // Switch from forward to reverse
  iter->SeekToFirst();
  iter->Next();
  iter->Next();
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");

  // Make sure iter stays at snapshot
  ASSERT_OK(Put("a", "va2"));
  ASSERT_OK(Put("a2", "va3"));
  ASSERT_OK(Put("b", "vb2"));
  ASSERT_OK(Put("c", "vc2"));
  ASSERT_OK(Delete("b"));
  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  delete iter;
}